

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DayNameOperator>>
               (timestamp_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong idx;
  char **ppcVar6;
  ulong uVar7;
  idx_t idx_00;
  ulong idx_01;
  ulong uVar8;
  string_t sVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar6 = &(result_data->value).pointer.ptr;
    for (idx_00 = 0; count != idx_00; idx_00 = idx_00 + 1) {
      sVar9 = DatePart::PartOperator<duckdb::DayNameOperator>::
              Operation<duckdb::timestamp_t,duckdb::string_t>
                        ((timestamp_t)ldata[idx_00].value,result_mask,idx_00,dataptr);
      uVar4 = sVar9.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar6 + -1);
      paVar1->length = (int)uVar4;
      paVar1->prefix[0] = (char)((ulong)uVar4 >> 0x20);
      paVar1->prefix[1] = (char)((ulong)uVar4 >> 0x28);
      paVar1->prefix[2] = (char)((ulong)uVar4 >> 0x30);
      paVar1->prefix[3] = (char)((ulong)uVar4 >> 0x38);
      *ppcVar6 = sVar9.value._8_8_;
      ppcVar6 = ppcVar6 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    idx_01 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar8 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar8 = count;
        }
LAB_00702fa5:
        ppcVar6 = &result_data[idx_01].value.pointer.ptr;
        for (; idx = idx_01, idx_01 < uVar8; idx_01 = idx_01 + 1) {
          sVar9 = DatePart::PartOperator<duckdb::DayNameOperator>::
                  Operation<duckdb::timestamp_t,duckdb::string_t>
                            ((timestamp_t)ldata[idx_01].value,result_mask,idx_01,dataptr);
          uVar4 = sVar9.value._0_8_;
          paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar6 + -1);
          paVar1->length = (int)uVar4;
          paVar1->prefix[0] = (char)((ulong)uVar4 >> 0x20);
          paVar1->prefix[1] = (char)((ulong)uVar4 >> 0x28);
          paVar1->prefix[2] = (char)((ulong)uVar4 >> 0x30);
          paVar1->prefix[3] = (char)((ulong)uVar4 >> 0x38);
          *ppcVar6 = sVar9.value._8_8_;
          ppcVar6 = ppcVar6 + 2;
        }
      }
      else {
        uVar3 = puVar2[uVar5];
        uVar8 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar8 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_00702fa5;
        idx = uVar8;
        if (uVar3 != 0) {
          ppcVar6 = &result_data[idx_01].value.pointer.ptr;
          for (uVar7 = 0; idx = uVar7 + idx_01, idx < uVar8; uVar7 = uVar7 + 1) {
            if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
              sVar9 = DatePart::PartOperator<duckdb::DayNameOperator>::
                      Operation<duckdb::timestamp_t,duckdb::string_t>
                                ((timestamp_t)ldata[idx_01 + uVar7].value,result_mask,idx,dataptr);
              uVar4 = sVar9.value._0_8_;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar6 + -1);
              paVar1->length = (int)uVar4;
              paVar1->prefix[0] = (char)((ulong)uVar4 >> 0x20);
              paVar1->prefix[1] = (char)((ulong)uVar4 >> 0x28);
              paVar1->prefix[2] = (char)((ulong)uVar4 >> 0x30);
              paVar1->prefix[3] = (char)((ulong)uVar4 >> 0x38);
              *ppcVar6 = sVar9.value._8_8_;
            }
            ppcVar6 = ppcVar6 + 2;
          }
        }
      }
      idx_01 = idx;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}